

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O2

int rnl(int x)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = mt_random();
  uVar1 = uVar1 % (uint)x;
  if (((int)u.moreluck + (int)u.uluck != 0) &&
     (iVar2 = rn2(0x32 - ((int)u.moreluck + (int)u.uluck)), iVar2 != 0)) {
    uVar3 = (int)u.moreluck + (int)u.uluck;
    if (-6 < (int)uVar3 && x < 0x10) {
      uVar3 = (uint)(short)((int)((uint)(ushort)((short)uVar3 >> 0xf) << 0x10 | uVar3 & 0xffff) / 3)
      ;
    }
    uVar1 = uVar1 - uVar3;
    if ((int)uVar1 < 0) {
      uVar1 = 0;
    }
    else if (x <= (int)uVar1) {
      uVar1 = x - 1;
    }
  }
  return uVar1;
}

Assistant:

static inline int rnl(int x)
{
	int i;

	i = RND(x);

	if (Luck && rn2(50 - Luck)) {
	    i -= (x <= 15 && Luck >= -5 ? Luck/3 : Luck);
	    if (i < 0) i = 0;
	    else if (i >= x) i = x-1;
	}

	return i;
}